

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

Real __thiscall soplex::Random::next_random(Random *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = this->lin_seed * 0x41c64e6d;
  this->lin_seed = iVar1 + 0x3039;
  uVar3 = this->xor_seed << 0xd ^ this->xor_seed;
  uVar3 = uVar3 >> 0x11 ^ uVar3;
  uVar3 = uVar3 << 5 ^ uVar3;
  this->xor_seed = uVar3;
  lVar2 = (ulong)this->cst_seed + (ulong)this->mwc_seed * 0x29a65ead;
  *(long *)&this->mwc_seed = lVar2;
  return (double)(iVar1 + uVar3 + 0x3039 + (int)lVar2) / 4294967295.0;
}

Assistant:

Real next_random()
   {
      uint64_t t;

      /* linear congruential */
      lin_seed = (uint32_t)(lin_seed * SOPLEX_RSTEP + SOPLEX_RADD);

      /* Xorshift */
      xor_seed ^= (xor_seed << 13);
      xor_seed ^= (xor_seed >> 17);
      xor_seed ^= (xor_seed << 5);

      /* Multiply-with-carry */
      t = UINT64_C(698769069) * mwc_seed + cst_seed;
      cst_seed = (uint32_t)(t >> 32);
      mwc_seed = (uint32_t) t;

      return (lin_seed + xor_seed + mwc_seed) / (Real)UINT32_MAX;
   }